

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool feintrack::is_intersect
               (float_t x1_1,float_t y1_1,float_t x2_1,float_t y2_1,float_t x1_2,float_t y1_2,
               float_t x2_2,float_t y2_2)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  float *pfVar4;
  double dVar5;
  bool local_51;
  float local_50;
  float local_4c;
  float_t y;
  float_t x;
  float fStack_40;
  bool trivial2;
  float_t b2;
  float_t a2;
  float fStack_34;
  bool trivial1;
  float_t b1;
  float_t a1;
  float_t eps;
  float_t y2_2_local;
  float_t x2_2_local;
  float_t y1_2_local;
  float_t x1_2_local;
  float_t y2_1_local;
  float_t x2_1_local;
  float_t y1_1_local;
  float_t x1_1_local;
  
  fStack_34 = 0.0;
  a2 = 0.0;
  a1 = y2_2;
  eps = x2_2;
  y2_2_local = y1_2;
  x2_2_local = x1_2;
  y1_2_local = y2_1;
  x1_2_local = x2_1;
  y2_1_local = y1_1;
  x2_1_local = x1_1;
  dVar5 = std::fabs((double)(ulong)(uint)(x1_1 - x2_1));
  bVar3 = 1e-05 <= SUB84(dVar5,0);
  if (bVar3) {
    fStack_34 = (y1_2_local - y2_1_local) / (x1_2_local - x2_1_local);
    a2 = (x1_2_local * y2_1_local + -(x2_1_local * y1_2_local)) / (x1_2_local - x2_1_local);
  }
  fStack_40 = 0.0;
  x = 0.0;
  dVar5 = std::fabs((double)(ulong)(uint)(x2_2_local - eps));
  bVar2 = 1e-05 <= SUB84(dVar5,0);
  if (bVar2) {
    fStack_40 = (a1 - y2_2_local) / (eps - x2_2_local);
    x = (eps * y2_2_local + -(x2_2_local * a1)) / (eps - x2_2_local);
  }
  y._3_1_ = !bVar2;
  if (bVar3) {
    if (y._3_1_) {
      local_4c = x2_2_local;
    }
    else {
      dVar5 = std::fabs((double)(ulong)(uint)(fStack_40 - fStack_34));
      if (SUB84(dVar5,0) <= 1e-05) {
        return false;
      }
      local_4c = (a2 - x) / (fStack_40 - fStack_34);
    }
    local_50 = fStack_34 * local_4c + a2;
  }
  else {
    if (y._3_1_) {
      dVar5 = std::fabs((double)(ulong)(uint)(x2_1_local - x2_2_local));
      return SUB84(dVar5,0) < 1e-05;
    }
    local_4c = x2_1_local;
    local_50 = fStack_40 * x2_1_local + x;
  }
  pfVar4 = std::min<float>(&x2_1_local,&x1_2_local);
  fVar1 = *pfVar4;
  pfVar4 = std::max<float>(&x2_1_local,&x1_2_local);
  bVar3 = in_range<float>(local_4c,fVar1,*pfVar4 + 1e-05);
  local_51 = false;
  if (bVar3) {
    pfVar4 = std::min<float>(&x2_2_local,&eps);
    fVar1 = *pfVar4;
    pfVar4 = std::max<float>(&x2_2_local,&eps);
    bVar3 = in_range<float>(local_4c,fVar1,*pfVar4 + 1e-05);
    local_51 = false;
    if (bVar3) {
      pfVar4 = std::min<float>(&y2_1_local,&y1_2_local);
      fVar1 = *pfVar4;
      pfVar4 = std::max<float>(&y2_1_local,&y1_2_local);
      bVar3 = in_range<float>(local_50,fVar1,*pfVar4 + 1e-05);
      local_51 = false;
      if (bVar3) {
        pfVar4 = std::min<float>(&y2_2_local,&a1);
        fVar1 = *pfVar4;
        pfVar4 = std::max<float>(&y2_2_local,&a1);
        local_51 = in_range<float>(local_50,fVar1,*pfVar4 + 1e-05);
      }
    }
  }
  return local_51;
}

Assistant:

bool is_intersect(float_t x1_1, float_t y1_1, float_t x2_1, float_t y2_1,
		float_t x1_2, float_t y1_2, float_t x2_2, float_t y2_2)
	{
		const float_t eps = 0.00001f; //Константа для сравнения на равентсво

		//Получение уравнения прямой, содержащей 1-й отрезок
		float_t a1(0), b1(0); //Коэффициенты 1-й прямой
		bool trivial1(false); //Вырожденный случай - прямая перпендикулярна оси OX

        if (fabs(x1_1 - x2_1) < eps)
		{
			trivial1 = true;
		}
		else
		{
			a1 = (y2_1 - y1_1) / (x2_1 - x1_1);
			b1 = (x2_1 * y1_1 - x1_1 * y2_1) / (x2_1 - x1_1);
		}

		//Получение уравнения прямой, содержащей 2-й отрезок
		float_t a2(0), b2(0); //Коэффициенты 2-й прямой
		bool trivial2(false); //Вырожденный случай - прямая перпендикулярна оси OX

        if (fabs(x1_2 - x2_2) < eps) //Вырожденный случай - прямая перпендикулярна оси OX
		{
			trivial2 = true;
		}
		else
		{
			a2 = (y2_2 - y1_2) / (x2_2 - x1_2);
			b2 = (x2_2 * y1_2 - x1_2 * y2_2) / (x2_2 - x1_2);
		}

		//Определение координат пересечения прямых
		float_t x(0), y(0);

		if (trivial1)
		{
			if (trivial2)
                return (fabs(x1_1 - x1_2) < eps);
			else
				x = x1_1;
			y = a2 * x + b2;
		}
		else
		{
			if (trivial2)
			{
				x = x1_2;
			}
			else
			{
                if (fabs(a2 - a1) > eps)
					x = (b1 - b2) / (a2 - a1);
				else
					return false;
			}
			y = a1 * x + b1;
		}

		return in_range(x, std::min(x1_1, x2_1), std::max(x1_1, x2_1) + eps) && in_range(x, std::min(x1_2, x2_2), std::max(x1_2, x2_2) + eps)
			   &&
			   in_range(y, std::min(y1_1, y2_1), std::max(y1_1, y2_1) + eps) && in_range(y, std::min(y1_2, y2_2), std::max(y1_2, y2_2) + eps);
	}